

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall GlobOpt::DoTrackCopiedValueForKills(GlobOpt *this,Value *value)

{
  ValueType *this_00;
  ValueInfo *valueInfo;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  ArrayValueInfo *pAVar5;
  Value *local_38;
  Value *value_local;
  
  local_38 = value;
  if (value == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x32a3,"(value)","value");
    if (!bVar2) goto LAB_0043e9b5;
    *puVar4 = 0;
  }
  valueInfo = value->valueInfo;
  this_00 = &valueInfo->super_ValueType;
  bVar2 = ValueType::IsAnyOptimizedArray(this_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x32a6,"(valueInfo->IsAnyOptimizedArray())",
                       "valueInfo->IsAnyOptimizedArray()");
    if (!bVar2) goto LAB_0043e9b5;
    *puVar4 = 0;
  }
  bVar2 = ValueType::IsArrayOrObjectWithArray(this_00);
  bVar3 = ValueType::IsOptimizedTypedArray(this_00);
  if (bVar2 == bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x32a9,"(!isJsArray == valueInfo->IsOptimizedTypedArray())",
                       "!isJsArray == valueInfo->IsOptimizedTypedArray()");
    if (!bVar3) {
LAB_0043e9b5:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar3 = ValueType::IsOptimizedVirtualTypedArray(this_00);
  VerifyArrayValueInfoForTracking(this,valueInfo,bVar2,this->currentBlock,false);
  if (!bVar3 && !bVar2) {
    bVar2 = ValueInfo::IsArrayValueInfo(valueInfo);
    if (!bVar2) {
      return;
    }
    pAVar5 = ValueInfo::AsArrayValueInfo(valueInfo);
    if (pAVar5->headSegmentLengthSym == (StackSym *)0x0) {
      return;
    }
  }
  JsUtil::
  BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::Add((this->currentBlock->globOptData).valuesToKillOnCalls,&local_38);
  return;
}

Assistant:

void
GlobOpt::DoTrackCopiedValueForKills(Value *const value)
{
    Assert(value);

    ValueInfo *const valueInfo = value->GetValueInfo();
    Assert(valueInfo->IsAnyOptimizedArray());

    const bool isJsArray = valueInfo->IsArrayOrObjectWithArray();
    Assert(!isJsArray == valueInfo->IsOptimizedTypedArray());

    const bool isVirtualTypedArray = valueInfo->IsOptimizedVirtualTypedArray();

#if DBG
    VerifyArrayValueInfoForTracking(valueInfo, isJsArray, currentBlock);
#endif

    if(!isJsArray && !isVirtualTypedArray && !(valueInfo->IsArrayValueInfo() && valueInfo->AsArrayValueInfo()->HeadSegmentLengthSym()))
    {
        return;
    }

    // Can't assume going forward that it will definitely be an array without disabling implicit calls, because the
    // array may be transformed into an ES5 array. Since array opts are enabled, implicit calls can be disabled, and we can
    // treat it as a definite value type going forward, but the value needs to be tracked so that something like a call can
    // revert the value type to a likely version.
    CurrentBlockData()->valuesToKillOnCalls->Add(value);
}